

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

int rgb2xterm256(int r,int g,int b)

{
  int iVar1;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int ql;
  int qb;
  int qg;
  int qr;
  int il;
  int ib;
  int ig;
  int ir;
  int av;
  uchar cube [6];
  int b_local;
  int g_local;
  int r_local;
  int local_4;
  
  cube[0] = '\0';
  cube[1] = '_';
  cube[2] = 0x87;
  cube[3] = 0xaf;
  cube[4] = 0xd7;
  cube[5] = 0xff;
  iVar1 = (int)((double)b * 0.114 + (double)r * 0.299 + (double)g * 0.587 + 0.5);
  if (iVar1 < 0xef) {
    local_40 = (iVar1 + -3) / 10;
  }
  else {
    local_40 = 0x17;
  }
  iVar1 = local_40 * 10 + 8;
  if (r < 0x30) {
    local_44 = 0;
  }
  else {
    if (r < 0x73) {
      local_48 = 1;
    }
    else {
      local_48 = (r + -0x23) / 0x28;
    }
    local_44 = local_48;
  }
  if (g < 0x30) {
    local_4c = 0;
  }
  else {
    if (g < 0x73) {
      local_50 = 1;
    }
    else {
      local_50 = (g + -0x23) / 0x28;
    }
    local_4c = local_50;
  }
  if (b < 0x30) {
    local_54 = 0;
  }
  else {
    if (b < 0x73) {
      local_58 = 1;
    }
    else {
      local_58 = (b + -0x23) / 0x28;
    }
    local_54 = local_58;
  }
  if ((iVar1 - r) * (iVar1 - r) + (iVar1 - g) * (iVar1 - g) + (iVar1 - b) * (iVar1 - b) <
      (int)(((uint)cube[local_44] - r) * ((uint)cube[local_44] - r) +
            ((uint)cube[local_4c] - g) * ((uint)cube[local_4c] - g) +
           ((uint)cube[local_54] - b) * ((uint)cube[local_54] - b))) {
    local_4 = local_40 + 0xe8;
  }
  else {
    local_4 = local_44 * 0x24 + local_4c * 6 + local_54 + 0x10;
  }
  return local_4;
}

Assistant:

static int rgb2xterm256(int r, int g, int b) {
    unsigned char cube[] = {0, 0137, 0207, 0257, 0327, 0377};
    int av, ir, ig, ib, il, qr, qg, qb, ql;
    av = r * .299 + g * .587 + b * .114 + .5;
    ql = (il = av > 238 ? 23 : (av - 3) / 10) * 10 + 8;
    qr = cube[(ir = UNCUBE(r))];
    qg = cube[(ig = UNCUBE(g))];
    qb = cube[(ib = UNCUBE(b))];
    if (SQR(qr - r) + SQR(qg - g) + SQR(qb - b) <=
        SQR(ql - r) + SQR(ql - g) + SQR(ql - b))
        return ir * 36 + ig * 6 + ib + 020;
    return il + 0350;
}